

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# setopt.c
# Opt level: O1

CURLcode Curl_setstropt(char **charp,char *s)

{
  bool bVar1;
  CURLcode CVar2;
  char *__s;
  size_t sVar3;
  
  (*Curl_cfree)(*charp);
  *charp = (char *)0x0;
  if (s == (char *)0x0) {
    return CURLE_OK;
  }
  __s = (*Curl_cstrdup)(s);
  if (__s == (char *)0x0) {
    CVar2 = CURLE_OUT_OF_MEMORY;
  }
  else {
    sVar3 = strlen(__s);
    if (sVar3 < 0x7a1201) {
      *charp = __s;
      bVar1 = true;
      CVar2 = CURLE_BAD_FUNCTION_ARGUMENT;
      goto LAB_0013f09c;
    }
    (*Curl_cfree)(__s);
    CVar2 = CURLE_BAD_FUNCTION_ARGUMENT;
  }
  bVar1 = false;
LAB_0013f09c:
  if (bVar1) {
    return CURLE_OK;
  }
  return CVar2;
}

Assistant:

CURLcode Curl_setstropt(char **charp, const char *s)
{
  /* Release the previous storage at `charp' and replace by a dynamic storage
     copy of `s'. Return CURLE_OK or CURLE_OUT_OF_MEMORY. */

  Curl_safefree(*charp);

  if(s) {
    char *str = strdup(s);

    if(str) {
      size_t len = strlen(str);
      if(len > CURL_MAX_INPUT_LENGTH) {
        free(str);
        return CURLE_BAD_FUNCTION_ARGUMENT;
      }
    }
    if(!str)
      return CURLE_OUT_OF_MEMORY;

    *charp = str;
  }

  return CURLE_OK;
}